

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularArray.hpp
# Opt level: O2

void __thiscall Lib::TriangularArray<int>::setSide(TriangularArray<int> *this,size_t side)

{
  ulong uVar1;
  void *placement;
  int *piVar2;
  ulong length;
  
  this->_2sideMinus1 = side * 2 - 1;
  uVar1 = (side * 2 + 2) * side * 2 >> 3;
  if (this->_capacity < uVar1) {
    length = this->_capacity * 2;
    if (length <= uVar1) {
      length = uVar1;
    }
    placement = Lib::alloc(length * 4);
    Lib::free(this->_data);
    this->_capacity = length;
    piVar2 = array_new<int>(placement,length);
    this->_data = piVar2;
  }
  return;
}

Assistant:

void setSide(size_t side)
  {
    ASS_G(side,0);
    _2sideMinus1=2*side-1;
    if(dataSize()>_capacity) {
      size_t newCapacity=std::max(_capacity*2, dataSize());
      void * mem=ALLOC_KNOWN(newCapacity*sizeof(T), "Lib::TriangularArray");

      array_delete(_data, _capacity);
      DEALLOC_KNOWN(_data, _capacity*sizeof(T), "Lib::TriangularArray");

      _capacity=newCapacity;
      _data=array_new<T>(mem, _capacity);
    }
  }